

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

void ZSTD_row_update(ZSTD_matchState_t *ms,BYTE *ip)

{
  BYTE *pBVar1;
  U32 *pUVar2;
  U16 *pUVar3;
  char cVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar9 = (ms->cParams).minMatch;
  uVar11 = 6;
  if (uVar9 < 6) {
    uVar11 = uVar9;
  }
  bVar5 = 5 - ((ms->cParams).searchLog < 5);
  pBVar1 = (ms->window).base;
  uVar6 = (ulong)ms->nextToUpdate;
  uVar9 = (uint)((long)ip - (long)pBVar1);
  if (ms->nextToUpdate < uVar9) {
    pUVar2 = ms->hashTable;
    pUVar3 = ms->tagTable;
    cVar4 = (char)ms->rowHashLog;
    do {
      if (uVar11 == 5) {
        uVar8 = *(long *)(pBVar1 + uVar6) * -0x30e4432345000000;
LAB_00633873:
        uVar7 = (uint)(uVar8 >> (0x38U - cVar4 & 0x3f));
      }
      else {
        if (uVar11 == 6) {
          uVar8 = *(long *)(pBVar1 + uVar6) * -0x30e4432340650000;
          goto LAB_00633873;
        }
        uVar7 = (uint)(*(int *)(pBVar1 + uVar6) * -0x61c8864f) >> (0x18U - cVar4 & 0x1f);
      }
      uVar8 = (ulong)((uVar7 >> 8) << (bVar5 & 0x1f));
      uVar10 = (byte)pUVar3[uVar8] + 0x1f & ~(-1 << (bVar5 & 0x1f));
      *(char *)(pUVar3 + uVar8) = (char)uVar10;
      *(char *)((long)pUVar3 + (ulong)uVar10 + 1 + uVar8 * 2) = (char)uVar7;
      pUVar2[uVar8 + uVar10] = (U32)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 < ((long)ip - (long)pBVar1 & 0xffffffffU));
  }
  ms->nextToUpdate = uVar9;
  return;
}

Assistant:

void ZSTD_row_update(ZSTD_matchState_t* const ms, const BYTE* ip) {
    const U32 rowLog = ms->cParams.searchLog < 5 ? 4 : 5;
    const U32 rowMask = (1u << rowLog) - 1;
    const U32 mls = MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */);

    DEBUGLOG(5, "ZSTD_row_update(), rowLog=%u", rowLog);
    ZSTD_row_update_internal(ms, ip, mls, rowLog, rowMask, 0 /* dont use cache */);
}